

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# centre_of_circle.hpp
# Opt level: O2

double boost::geometry::determinant<double>
                 (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *m)

{
  int iVar1;
  size_type sVar2;
  reference pdVar3;
  size_type i;
  ulong i_00;
  permutation_matrix<unsigned_long,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>_>
  pm;
  double local_30;
  unbounded_array<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  numeric::ublas::
  permutation_matrix<unsigned_long,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::permutation_matrix
            ((permutation_matrix<unsigned_long,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)&local_28,m->size1_);
  sVar2 = numeric::ublas::
          lu_factorize<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::permutation_matrix<unsigned_long,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>>>
                    (m,(permutation_matrix<unsigned_long,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&local_28);
  local_30 = 0.0;
  if (sVar2 == 0) {
    iVar1 = determinant_sign((permutation_matrix<unsigned_long,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)&local_28);
    local_30 = (double)iVar1;
    for (i_00 = 0; i_00 < m->size1_; i_00 = i_00 + 1) {
      pdVar3 = numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::at_element(m,i_00,i_00);
      local_30 = local_30 * *pdVar3;
    }
  }
  numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>::~unbounded_array
            (&local_28);
  return local_30;
}

Assistant:

T determinant( boost::numeric::ublas::matrix<T> &m )
    {
        namespace bnu = boost::numeric::ublas;

        bnu::permutation_matrix<std::size_t> pm(m.size1());
        T det;
        if( bnu::lu_factorize(m, pm) )
            det = 0.0;
        else
        {
            det = determinant_sign( pm );
            for(typename boost::numeric::ublas::matrix<T>::size_type i = 0; i < m.size1(); i++)
                det *= m(i,i); // multiply by elements on diagonal
        }
        return det;
    }